

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

void insert_arg_range(rtosc_arg_val_t *arg,int32_t num,rtosc_arg_val_t *lhsarg,int has_delta,
                     rtosc_arg_val_t *delta,int lhs_overlap,int delta_less_is_endless)

{
  undefined8 *puVar1;
  size_t sVar2;
  int in_ECX;
  undefined8 *puVar3;
  char *in_RDX;
  undefined4 in_ESI;
  undefined1 *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int32_t i;
  rtosc_arg_val_t *first_arg;
  int32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_3c;
  undefined1 *local_8;
  
  local_8 = in_RDI;
  if (in_ECX != 0) {
    local_8 = in_RDI + 0x18;
    *(undefined8 *)(in_RDI + 0x18) = *in_R8;
    *(undefined8 *)(in_RDI + 0x20) = in_R8[1];
    *(undefined8 *)(in_RDI + 0x28) = in_R8[2];
  }
  if (in_R9D == 0) {
    sVar2 = incsize((rtosc_arg_val_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                   );
    memcpy(local_8 + 0x18,in_RDX,sVar2 * 0x18);
  }
  else {
    if (*in_RDX == 'a') {
      for (local_3c = rtosc_av_arr_len((rtosc_arg_val_t *)0x109024); 0 < local_3c;
          local_3c = local_3c + -1) {
        puVar1 = (undefined8 *)(local_8 + (long)(local_3c + 1) * 0x18);
        puVar3 = (undefined8 *)(local_8 + (long)local_3c * 0x18);
        *puVar1 = *puVar3;
        puVar1[1] = puVar3[1];
        puVar1[2] = puVar3[2];
      }
    }
    *(undefined8 *)(local_8 + 0x18) = *(undefined8 *)in_RDX;
    *(undefined8 *)(local_8 + 0x20) = *(undefined8 *)(in_RDX + 8);
    *(undefined8 *)(local_8 + 0x28) = *(undefined8 *)(in_RDX + 0x10);
  }
  *in_RDI = 0x2d;
  if ((in_ECX == 0) && (in_stack_00000008 != 0)) {
    in_ESI = 0;
  }
  rtosc_av_rep_num_set
            ((rtosc_arg_val_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
            );
  rtosc_av_rep_has_delta_set
            ((rtosc_arg_val_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
            );
  return;
}

Assistant:

static void insert_arg_range(rtosc_arg_val_t* arg, int32_t num,
                             const rtosc_arg_val_t* lhsarg,
                             int has_delta, const rtosc_arg_val_t* delta,
                             int lhs_overlap,
                             int delta_less_is_endless)
{
    rtosc_arg_val_t* first_arg = arg;
    if(has_delta)
        *++arg = *delta;
    if(lhs_overlap)
    {
        if(lhsarg->type == 'a')
        {
            // we inserted an 'a' element, so we need to
            // shift more than one element
            // the shifting amount is always one since array ranges
            // are delta-less
            // we have: '-'  a  a a a
            // =>       '-' 'a' a a a a
            for(int32_t i = rtosc_av_arr_len(lhsarg); i > 0; --i)
                arg[i+1] = arg[i];
        }
        *++arg = *lhsarg;
    }
    else
    {
        memcpy(++arg, lhsarg, incsize(lhsarg) * sizeof(rtosc_arg_val_t));
    }
    first_arg->type = '-';
    rtosc_av_rep_num_set(first_arg, (!has_delta && delta_less_is_endless) ? 0 : num);
    rtosc_av_rep_has_delta_set(first_arg, has_delta);
}